

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O2

string * __thiscall
gnuplotio::GnuplotTmpfileCollection::make_tmpfile_abi_cxx11_
          (string *__return_storage_ptr__,GnuplotTmpfileCollection *this)

{
  GnuplotTmpfile *this_00;
  shared_ptr<gnuplotio::GnuplotTmpfile> tmp_file;
  
  this_00 = (GnuplotTmpfile *)operator_new(0x28);
  GnuplotTmpfile::GnuplotTmpfile(this_00,false);
  std::__shared_ptr<gnuplotio::GnuplotTmpfile,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<gnuplotio::GnuplotTmpfile,void>
            ((__shared_ptr<gnuplotio::GnuplotTmpfile,(__gnu_cxx::_Lock_policy)2> *)&tmp_file,this_00
            );
  std::
  vector<std::shared_ptr<gnuplotio::GnuplotTmpfile>,_std::allocator<std::shared_ptr<gnuplotio::GnuplotTmpfile>_>_>
  ::push_back(&this->tmp_files,(value_type *)&tmp_file);
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             tmp_file.super___shared_ptr<gnuplotio::GnuplotTmpfile,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tmp_file.super___shared_ptr<gnuplotio::GnuplotTmpfile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::string make_tmpfile() {
        const bool debug_messages = false;
        std::shared_ptr<GnuplotTmpfile> tmp_file(new GnuplotTmpfile(debug_messages));
        // The file will be removed once the pointer is removed from the
        // tmp_files container.
        tmp_files.push_back(tmp_file);
        return tmp_file->file.string();
    }